

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

void draw_chesses(char *chesses)

{
  long lVar1;
  char *__format;
  int row;
  long lVar2;
  
  for (lVar2 = 1; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    for (lVar1 = -0xf; lVar1 != 0; lVar1 = lVar1 + 1) {
      __format = anon_var_dwarf_66;
      if ((chesses[lVar1 + 0xf] & 1U) != 0) {
        __format = anon_var_dwarf_70;
      }
      if (chesses[lVar1 + 0xf] == 0) {
        __format = anon_var_dwarf_43;
      }
      printf(__format);
    }
    putchar(10);
    chesses = chesses + 0xf;
  }
  return;
}

Assistant:

void draw_chesses(char chesses[]) {
    for (int row = 1; row <= 15; row++) {
        for (int col = 1; col <= 15; col++) {
            int index = (row - 1) * 15 + (col - 1);
            int value = chesses[index];
            if (value == 0) {
                printf(CHESS_BOARD);
            }
            else if (value % 2 == 0) {
                printf(BLACK_CHESS);
            } 
            else {
                printf(WHITE_CHESS);
            }
        }
        printf("\n");
    }
}